

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMotorRotationDriveline::Setup(ChLinkMotorRotationDriveline *this)

{
  long lVar1;
  element_type *peVar2;
  char cVar3;
  int iVar4;
  
  cVar3 = (**(code **)(**(long **)&(this->super_ChLinkMotorRotation).field_0x278 + 0x48))();
  if (cVar3 != '\0') {
    lVar1 = *(long *)&(this->super_ChLinkMotorRotation).field_0x278;
    *(uint *)(lVar1 + 0x68) =
         (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_x;
    *(uint *)(lVar1 + 0x6c) =
         (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_w;
  }
  iVar4 = (*(((this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    peVar2 = (this->innershaft2).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (peVar2->super_ChPhysicsItem).offset_x =
         (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_x + 1;
    (peVar2->super_ChPhysicsItem).offset_w =
         (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
         super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_w + 1;
  }
  iVar4 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  (((this->innerconstraint1).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_ChPhysicsItem).offset_L =
       iVar4 + (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.
               super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  (((this->innerconstraint2).super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>.
   _M_ptr)->super_ChPhysicsItem).offset_L =
       iVar4 + 1 +
       (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
       super_ChLink.super_ChLinkBase.super_ChPhysicsItem.offset_L;
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::Setup() {
	if (innershaft1->IsActive()) {
        innershaft1->SetOffset_x(this->offset_x + 0);
        innershaft1->SetOffset_w(this->offset_w + 0);
	}
    if (innershaft2->IsActive()) {
        innershaft2->SetOffset_x(this->offset_x + 1);
        innershaft2->SetOffset_w(this->offset_w + 1);
    }
    int nc = mask.nconstr;
    innerconstraint1->SetOffset_L(this->offset_L + nc + 0);
    innerconstraint2->SetOffset_L(this->offset_L + nc + 1);
}